

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  u8 *__src;
  char *__dest;
  ushort uVar1;
  u16 uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ushort *puVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  u8 *__src_00;
  uint uVar15;
  ulong uVar16;
  
  __src = pPage->aData;
  uVar16 = (ulong)pPage->hdrOffset;
  uVar8 = pPage->cellOffset;
  uVar3 = pPage->nCell;
  uVar11 = (uint)uVar8 + (uint)uVar3 * 2;
  uVar9 = pPage->pBt->usableSize;
  if (nMaxFrag < (int)(uint)__src[uVar16 + 7]) {
LAB_001504ac:
    uVar15 = uVar9;
    if ((ulong)uVar3 != 0) {
      uVar7 = *(ushort *)(__src + uVar16 + 5);
      __dest = pPage->pBt->pPager->pTmpSpace;
      memcpy(__dest,__src,(long)(int)uVar9);
      for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
        uVar1 = *(ushort *)(__src + uVar13 * 2 + (ulong)uVar8) << 8 |
                *(ushort *)(__src + uVar13 * 2 + (ulong)uVar8) >> 8;
        if ((int)(uVar9 - 4) < (int)(uint)uVar1) {
          iVar5 = 0x11b1e;
          goto LAB_00150631;
        }
        __src_00 = (u8 *)(__dest + uVar1);
        uVar2 = (*pPage->xCellSize)(pPage,__src_00);
        uVar15 = uVar15 - uVar2;
        if (((int)uVar15 < (int)(uint)(ushort)(uVar7 << 8 | uVar7 >> 8)) ||
           ((int)uVar9 < (int)((uint)uVar1 + (uint)uVar2))) {
          iVar5 = 0x11b24;
          goto LAB_00150631;
        }
        *(ushort *)(__src + uVar13 * 2 + (ulong)uVar8) = (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
        memcpy(__src + uVar15,__src_00,(ulong)uVar2);
      }
    }
    __src[uVar16 + 7] = '\0';
    uVar9 = 0;
  }
  else {
    uVar7 = *(ushort *)(__src + uVar16 + 1) << 8 | *(ushort *)(__src + uVar16 + 1) >> 8;
    if ((int)(uVar9 - 4) < (int)(uint)uVar7) {
      iVar5 = 0x11ae9;
      goto LAB_00150631;
    }
    uVar14 = (uint)uVar7;
    if (uVar7 == 0) goto LAB_001504ac;
    uVar1 = *(ushort *)(__src + uVar7) << 8 | *(ushort *)(__src + uVar7) >> 8;
    if (uVar9 - 4 < (uint)uVar1) {
      iVar5 = 0x11aec;
      goto LAB_00150631;
    }
    if ((uVar1 != 0) && ((__src[uVar1] != '\0' || (__src[(ulong)uVar1 + 1] != '\0'))))
    goto LAB_001504ac;
    uVar3 = *(ushort *)(__src + uVar16 + 5) << 8 | *(ushort *)(__src + uVar16 + 5) >> 8;
    iVar5 = uVar14 - uVar3;
    if (uVar14 < uVar3 || iVar5 == 0) {
      iVar5 = 0x11af4;
      goto LAB_00150631;
    }
    uVar4 = *(ushort *)(__src + (ulong)uVar7 + 2) << 8 | *(ushort *)(__src + (ulong)uVar7 + 2) >> 8;
    uVar12 = (uint)uVar4;
    uVar15 = (uint)uVar4 + (uint)uVar7;
    if (uVar1 == 0) {
      uVar10 = 0;
      if ((int)uVar9 < (int)uVar15) {
        iVar5 = 0x11afd;
        goto LAB_00150631;
      }
    }
    else {
      if (uVar1 < uVar15) {
        iVar5 = 0x11af7;
        goto LAB_00150631;
      }
      uVar7 = *(ushort *)(__src + (ulong)uVar1 + 2) << 8 |
              *(ushort *)(__src + (ulong)uVar1 + 2) >> 8;
      if ((int)uVar9 < (int)((uint)uVar7 + (uint)uVar1)) {
        iVar5 = 0x11af9;
        goto LAB_00150631;
      }
      memmove(__src + (uVar7 + uVar15),__src + uVar15,(long)(int)(uVar1 - uVar15));
      uVar10 = (uint)uVar7;
      uVar12 = uVar4 + uVar10;
    }
    uVar15 = uVar12 + uVar3;
    memmove(__src + uVar15,__src + uVar3,(long)iVar5);
    for (puVar6 = (ushort *)(__src + uVar8); puVar6 < __src + uVar11; puVar6 = puVar6 + 1) {
      uVar8 = *puVar6 << 8 | *puVar6 >> 8;
      uVar9 = uVar12;
      if ((uVar8 < uVar14) || (uVar9 = uVar10, (uint)uVar8 < (uint)uVar1)) {
        uVar8 = uVar8 + (short)uVar9;
        *puVar6 = uVar8 * 0x100 | uVar8 >> 8;
      }
    }
    uVar9 = (uint)__src[uVar16 + 7];
  }
  if (uVar9 + (uVar15 - uVar11) == pPage->nFree) {
    *(ushort *)(__src + uVar16 + 5) = (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
    (__src + uVar16 + 1)[0] = '\0';
    (__src + uVar16 + 1)[1] = '\0';
    memset(__src + uVar11,0,(long)(int)(uVar15 - uVar11));
    return 0;
  }
  iVar5 = 0x11b32;
LAB_00150631:
  iVar5 = sqlite3CorruptError(iVar5);
  return iVar5;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */
  int iCellStart;            /* First cell offset in input */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( iFree+sz>usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  iCellStart = get2byte(&data[hdr+5]);
  if( nCell>0 ){
    temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
    memcpy(temp, data, usableSize);
    src = temp;
    for(i=0; i<nCell; i++){
      u8 *pAddr;     /* The i-th cell pointer */
      pAddr = &data[cellOffset + i*2];
      pc = get2byte(pAddr);
      testcase( pc==iCellFirst );
      testcase( pc==iCellLast );
      /* These conditions have already been verified in btreeInitPage()
      ** if PRAGMA cell_size_check=ON.
      */
      if( pc>iCellLast ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( pc>=0 && pc<=iCellLast );
      size = pPage->xCellSize(pPage, &src[pc]);
      cbrk -= size;
      if( cbrk<iCellStart || pc+size>usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( cbrk+size<=usableSize && cbrk>=iCellStart );
      testcase( cbrk+size==usableSize );
      testcase( pc+size==usableSize );
      put2byte(pAddr, cbrk);
      memcpy(&data[cbrk], &src[pc], size);
    }
  }
  data[hdr+7] = 0;

defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}